

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O2

pcre * __thiscall re2::PCRE::Compile(PCRE *this,Anchor anchor)

{
  string *this_00;
  ostream *poVar1;
  allocator local_191;
  string wrapped;
  
  if (anchor == ANCHOR_BOTH) {
    std::__cxx11::string::string((string *)&wrapped,"(?:",&local_191);
    std::__cxx11::string::append((string *)&wrapped);
    std::__cxx11::string::append((char *)&wrapped);
    std::__cxx11::string::~string((string *)&wrapped);
  }
  if (this->error_ == (string *)empty_string_abi_cxx11_) {
    this_00 = (string *)operator_new(0x20);
    std::__cxx11::string::string((string *)this_00,"",(allocator *)&wrapped);
    this->error_ = this_00;
  }
  LogMessage::LogMessage
            ((LogMessage *)&wrapped,
             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/pcre.cc",0xac,2)
  ;
  poVar1 = std::operator<<((ostream *)&wrapped._M_string_length,"Error compiling \'");
  poVar1 = std::operator<<(poVar1,(string *)this);
  poVar1 = std::operator<<(poVar1,"\': ");
  std::operator<<(poVar1,"");
  LogMessage::~LogMessage((LogMessage *)&wrapped);
  return (pcre *)0x0;
}

Assistant:

pcre* PCRE::Compile(Anchor anchor) {
  // Special treatment for anchoring.  This is needed because at
  // runtime pcre only provides an option for anchoring at the
  // beginning of a string.
  //
  // There are three types of anchoring we want:
  //    UNANCHORED      Compile the original pattern, and use
  //                    a pcre unanchored match.
  //    ANCHOR_START    Compile the original pattern, and use
  //                    a pcre anchored match.
  //    ANCHOR_BOTH     Tack a "\z" to the end of the original pattern
  //                    and use a pcre anchored match.

  const char* error = "";
  int eoffset;
  pcre* re;
  if (anchor != ANCHOR_BOTH) {
    re = pcre_compile(pattern_.c_str(),
                      (options_ & EnabledCompileOptions),
                      &error, &eoffset, NULL);
  } else {
    // Tack a '\z' at the end of PCRE.  Parenthesize it first so that
    // the '\z' applies to all top-level alternatives in the regexp.
    string wrapped = "(?:";  // A non-counting grouping operator
    wrapped += pattern_;
    wrapped += ")\\z";
    re = pcre_compile(wrapped.c_str(),
                      (options_ & EnabledCompileOptions),
                      &error, &eoffset, NULL);
  }
  if (re == NULL) {
    if (error_ == &empty_string) error_ = new string(error);
    PCREPORT(ERROR) << "Error compiling '" << pattern_ << "': " << error;
  }
  return re;
}